

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

void anon_unknown.dwarf_519f::do_free_pages(Span *span,void *ptr)

{
  undefined8 *puVar1;
  LogItem b;
  LogItem b_00;
  LogItem c;
  LogItem c_00;
  LogItem d;
  LogItem d_00;
  undefined4 uStack_84;
  anon_union_8_4_e5b1a622_for_u_ aStack_80;
  undefined4 uStack_74;
  anon_union_8_4_e5b1a622_for_u_ aStack_70;
  undefined4 uStack_64;
  anon_union_8_4_e5b1a622_for_u_ aStack_60;
  undefined4 uStack_54;
  anon_union_8_4_e5b1a622_for_u_ aStack_50;
  undefined4 uStack_44;
  anon_union_8_4_e5b1a622_for_u_ aStack_40;
  undefined4 uStack_34;
  anon_union_8_4_e5b1a622_for_u_ aStack_30;
  SpinLockHolder local_28;
  SpinLockHolder h;
  
  if ((span->field_0x2b & 3) != 0) {
    d._4_4_ = uStack_64;
    d.tag_ = 4;
    c._4_4_ = uStack_74;
    c.tag_ = 4;
    b._4_4_ = uStack_84;
    b.tag_ = 4;
    b.u_.str = aStack_80.str;
    c.u_.str = aStack_70.str;
    d.u_.str = aStack_60.str;
    tcmalloc::Log(kCrash,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tcmalloc.cc"
                  ,0x5d4,(LogItem)(ZEXT816(0x122743) << 0x40),b,c,d);
  }
  if ((void *)(span->start << 0xd) != ptr) {
    d_00._4_4_ = uStack_34;
    d_00.tag_ = 4;
    c_00._4_4_ = uStack_44;
    c_00.tag_ = 4;
    b_00._4_4_ = uStack_54;
    b_00.tag_ = 4;
    b_00.u_.str = aStack_50.str;
    c_00.u_.str = aStack_40.str;
    d_00.u_.str = aStack_30.str;
    tcmalloc::Log(kCrash,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tcmalloc.cc"
                  ,0x5d7,(LogItem)(ZEXT816(0x122759) << 0x40),b_00,c_00,d_00);
  }
  local_28.lock_ = (SpinLock *)(tcmalloc::Static::pageheap_ + 8);
  SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
  if ((span->field_0x2b & 4) != 0) {
    puVar1 = (undefined8 *)(span->field_4).objects;
    tcmalloc::DLL_Remove(span);
    *puVar1 = tcmalloc::Static::stacktrace_allocator_._16_8_;
    tcmalloc::Static::stacktrace_allocator_._24_4_ =
         tcmalloc::Static::stacktrace_allocator_._24_4_ + -1;
    tcmalloc::Static::stacktrace_allocator_._16_8_ = puVar1;
    (span->field_4).objects = (void *)0x0;
  }
  tcmalloc::PageHeap::DeleteLocked((PageHeap *)tcmalloc::Static::pageheap_,span);
  SpinLockHolder::~SpinLockHolder(&local_28);
  return;
}

Assistant:

static ATTRIBUTE_NOINLINE void do_free_pages(Span* span, void* ptr) {
  // Check to see if the object is in use.
  CHECK_CONDITION_PRINT(span->location == Span::IN_USE,
                        "Object was not in-use");
  CHECK_CONDITION_PRINT(
      span->start << kPageShift == reinterpret_cast<uintptr_t>(ptr),
      "Pointer is not pointing to the start of a span");

  Static::pageheap()->PrepareAndDelete(span, [&] () {
    if (span->sample) {
      StackTrace* st = reinterpret_cast<StackTrace*>(span->objects);
      tcmalloc::DLL_Remove(span);
      Static::stacktrace_allocator()->Delete(st);
      span->objects = nullptr;
    }
  });
}